

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::GetParametersTest::TestDefaultFramebuffer
          (GetParametersTest *this)

{
  ostringstream *this_00;
  ostringstream *this_01;
  undefined4 uVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  MessageBuilder *pMVar4;
  bool bVar5;
  GLchar **value;
  long lVar6;
  GLint parameter_dsa;
  GLint parameter_legacy;
  int local_1d0;
  int local_1cc;
  GetParametersTest *local_1c8;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [384];
  long lVar3;
  
  local_1c8 = this;
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  this_00 = (ostringstream *)(local_1b0 + 8);
  bVar5 = true;
  value = TestDefaultFramebuffer::pnames_strings;
  lVar6 = 0;
  do {
    if (lVar6 == 0x18) {
      return bVar5;
    }
    local_1cc = 0;
    local_1d0 = 0;
    uVar1 = *(undefined4 *)((long)TestDefaultFramebuffer::pnames + lVar6);
    (**(code **)(lVar3 + 0x838))(0x8d40,uVar1,&local_1cc);
    err = (**(code **)(lVar3 + 0x800))();
    glu::checkError(err,"glGetFramebufferParameteriv has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0xed9);
    (**(code **)(lVar3 + 0x918))(0,uVar1,&local_1d0);
    iVar2 = (**(code **)(lVar3 + 0x800))();
    if (iVar2 == 0) {
      if (local_1cc != local_1d0) {
        local_1b0._0_8_ = ((local_1c8->super_TestCase).m_context)->m_testCtx->m_log;
        this_01 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(this_01);
        std::operator<<((ostream *)this_01,"GetNamedFramebufferParameteriv returned ");
        std::ostream::operator<<(this_01,local_1d0);
        std::operator<<((ostream *)this_01,", but ");
        std::ostream::operator<<(this_01,local_1cc);
        std::operator<<((ostream *)this_01," was expected for ");
        pMVar4 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value);
        std::operator<<(&(pMVar4->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                        " parameter name of default object.");
        tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_00affce5;
      }
    }
    else {
      local_1b0._0_8_ = ((local_1c8->super_TestCase).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"GetNamedFramebufferParameteriv unexpectedly generated ");
      local_1c0.m_getName = glu::getErrorName;
      local_1c0.m_value = iVar2;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
      std::operator<<((ostream *)this_00," error when called with ");
      pMVar4 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value);
      std::operator<<(&(pMVar4->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                      " parameter name for default framebuffer.");
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00affce5:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
      bVar5 = false;
    }
    lVar6 = lVar6 + 4;
    value = value + 1;
  } while( true );
}

Assistant:

bool GetParametersTest::TestDefaultFramebuffer()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Result. */
	bool is_ok = true;

	static const glw::GLenum pnames[] = { GL_DOUBLEBUFFER,
										  GL_IMPLEMENTATION_COLOR_READ_FORMAT,
										  GL_IMPLEMENTATION_COLOR_READ_TYPE,
										  GL_SAMPLES,
										  GL_SAMPLE_BUFFERS,
										  GL_STEREO };

	static const glw::GLchar* pnames_strings[] = { "GL_DOUBLEBUFFER",
												   "GL_IMPLEMENTATION_COLOR_READ_FORMAT",
												   "GL_IMPLEMENTATION_COLOR_READ_TYPE",
												   "GL_SAMPLES",
												   "GL_SAMPLE_BUFFERS",
												   "GL_STEREO" };

	glw::GLuint pnames_count = sizeof(pnames) / sizeof(pnames[0]);

	for (glw::GLuint i = 0; i < pnames_count; ++i)
	{
		glw::GLint parameter_legacy = 0;
		glw::GLint parameter_dsa	= 0;

		gl.getFramebufferParameteriv(GL_FRAMEBUFFER, pnames[i], &parameter_legacy);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetFramebufferParameteriv has failed");

		gl.getNamedFramebufferParameteriv(0, pnames[i], &parameter_dsa);

		if (glw::GLenum error = gl.getError())
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "GetNamedFramebufferParameteriv unexpectedly generated "
				<< glu::getErrorStr(error) << " error when called with " << pnames_strings[i]
				<< " parameter name for default framebuffer." << tcu::TestLog::EndMessage;

			is_ok = false;

			continue;
		}

		if (parameter_legacy != parameter_dsa)
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "GetNamedFramebufferParameteriv returned "
												<< parameter_dsa << ", but " << parameter_legacy << " was expected for "
												<< pnames_strings[i] << " parameter name of default object."
												<< tcu::TestLog::EndMessage;

			is_ok = false;
		}
	}

	return is_ok;
}